

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreencommon.cpp
# Opt level: O0

QRect * __thiscall
QOffscreenBackingStore::grabWindow(QOffscreenBackingStore *this,WId window,QRect *rect)

{
  bool bVar1;
  int iVar2;
  undefined8 *in_RCX;
  unsigned_long_long *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QRect adjusted;
  QRect area;
  undefined4 in_stack_ffffffffffffff38;
  ImageConversionFlag in_stack_ffffffffffffff3c;
  QRect *defaultValue;
  QHash<unsigned_long_long,_QRect> *this_00;
  QRect *p;
  QRect *in_stack_ffffffffffffff78;
  QImage local_80 [24];
  QPoint local_68;
  QRect local_60;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  QRect local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.x2.m_i = -0x55555556;
  local_20.y2.m_i = -0x55555556;
  local_20.x1.m_i = -0x55555556;
  local_20.y1.m_i = -0x55555556;
  this_00 = (QHash<unsigned_long_long,_QRect> *)(in_RSI + 5);
  defaultValue = in_RDI;
  p = in_RDI;
  QRect::QRect(in_RDI);
  local_20 = QHash<unsigned_long_long,_QRect>::value(this_00,in_RSI,defaultValue);
  bVar1 = QRect::isNull(in_RDI);
  if (bVar1) {
    QPixmap::QPixmap((QPixmap *)in_RDI);
  }
  else {
    local_40._0_8_ = *in_RCX;
    local_40._8_8_ = in_RCX[1];
    iVar2 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if (iVar2 < 1) {
      QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      QRect::setWidth(in_RDI,in_stack_ffffffffffffff3c);
    }
    iVar2 = QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if (iVar2 < 1) {
      QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      QRect::setHeight(in_RDI,in_stack_ffffffffffffff3c);
    }
    local_68 = QRect::topLeft((QRect *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                             );
    local_60 = QRect::translated(in_stack_ffffffffffffff78,(QPoint *)p);
    local_50 = QRect::operator&(&local_60,(QRect *)&local_20);
    local_40 = local_50;
    bVar1 = QRect::isEmpty(in_RDI);
    if (bVar1) {
      QPixmap::QPixmap((QPixmap *)in_RDI);
    }
    else {
      QImage::copy((QRect *)local_80);
      QFlags<Qt::ImageConversionFlag>::QFlags
                ((QFlags<Qt::ImageConversionFlag> *)in_RDI,in_stack_ffffffffffffff3c);
      QPixmap::fromImage((QImage *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                         (QFlagsStorageHelper<Qt::ImageConversionFlag,_4>)
                         SUB84((ulong)defaultValue >> 0x20,0));
      QImage::~QImage(local_80);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return defaultValue;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QOffscreenBackingStore::grabWindow(WId window, const QRect &rect) const
{
    QRect area = m_windowAreaHash.value(window, QRect());
    if (area.isNull())
        return QPixmap();

    QRect adjusted = rect;
    if (adjusted.width() <= 0)
        adjusted.setWidth(area.width());
    if (adjusted.height() <= 0)
        adjusted.setHeight(area.height());

    adjusted = adjusted.translated(area.topLeft()) & area;

    if (adjusted.isEmpty())
        return QPixmap();

    return QPixmap::fromImage(m_image.copy(adjusted));
}